

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

int Rtm_ObjGetDegreeFwd(Rtm_Obj_t *pObj)

{
  Rtm_Obj_t *pRVar1;
  int local_20;
  int local_1c;
  int Degree;
  int i;
  Rtm_Obj_t *pFanin;
  Rtm_Obj_t *pObj_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < (int)(*(uint *)&pObj->field_0x8 >> 7 & 0xff);
      local_1c = local_1c + 1) {
    pRVar1 = Rtm_ObjFanin(pObj,local_1c);
    local_20 = Abc_MaxInt(local_20,*(uint *)&pRVar1->field_0x8 >> 0xf);
  }
  return local_20 + 1;
}

Assistant:

int Rtm_ObjGetDegreeFwd( Rtm_Obj_t * pObj )
{
    Rtm_Obj_t * pFanin;
    int i, Degree = 0;
    Rtm_ObjForEachFanin( pObj, pFanin, i )
        Degree = Abc_MaxInt( Degree, (int)pFanin->Num );
    return Degree + 1;
}